

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosTagger.hpp
# Opt level: O0

char * __thiscall cppjieba::PosTagger::SpecialRule(PosTagger *this,RuneStrArray *unicode)

{
  size_t sVar1;
  RuneStr *pRVar2;
  LocalVector<cppjieba::RuneStr> *in_RSI;
  bool bVar3;
  size_t i;
  size_t eng;
  size_t m;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  char *local_8;
  
  local_20 = 0;
  local_28 = 0;
  local_30 = 0;
  while( true ) {
    sVar1 = limonp::LocalVector<cppjieba::RuneStr>::size(in_RSI);
    bVar3 = false;
    if (local_30 < sVar1) {
      sVar1 = limonp::LocalVector<cppjieba::RuneStr>::size(in_RSI);
      bVar3 = local_28 < sVar1 >> 1;
    }
    if (!bVar3) break;
    pRVar2 = limonp::LocalVector<cppjieba::RuneStr>::operator[](in_RSI,local_30);
    if (pRVar2->rune < 0x80) {
      local_28 = local_28 + 1;
      pRVar2 = limonp::LocalVector<cppjieba::RuneStr>::operator[](in_RSI,local_30);
      if ((0x2f < pRVar2->rune) &&
         (pRVar2 = limonp::LocalVector<cppjieba::RuneStr>::operator[](in_RSI,local_30),
         pRVar2->rune < 0x3a)) {
        local_20 = local_20 + 1;
      }
    }
    local_30 = local_30 + 1;
  }
  if (local_28 == 0) {
    local_8 = "x";
  }
  else if (local_20 == local_28) {
    local_8 = "m";
  }
  else {
    local_8 = "eng";
  }
  return local_8;
}

Assistant:

const char* SpecialRule(const RuneStrArray& unicode) const {
    size_t m = 0;
    size_t eng = 0;
    for (size_t i = 0; i < unicode.size() && eng < unicode.size() / 2; i++) {
      if (unicode[i].rune < 0x80) {
        eng ++;
        if ('0' <= unicode[i].rune && unicode[i].rune <= '9') {
          m++;
        }
      }
    }
    // ascii char is not found
    if (eng == 0) {
      return POS_X;
    }
    // all the ascii is number char
    if (m == eng) {
      return POS_M;
    }
    // the ascii chars contain english letter
    return POS_ENG;
  }